

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

int __thiscall FNodeBuilder::FVertexMapSimple::InsertVertex(FVertexMapSimple *this,FPrivVert *vert)

{
  uint uVar1;
  
  vert->segs = 0xffffffff;
  vert->segs2 = 0xffffffff;
  uVar1 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Push
                    (&this->MyBuilder->Vertices,vert);
  return uVar1;
}

Assistant:

int FNodeBuilder::FVertexMapSimple::InsertVertex (FNodeBuilder::FPrivVert &vert)
{
	vert.segs = DWORD_MAX;
	vert.segs2 = DWORD_MAX;
	return (int)MyBuilder.Vertices.Push (vert);
}